

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  stbi_uc *psVar2;
  long lVar3;
  stbi_uc *psVar4;
  char *pcVar5;
  long *in_FS_OFFSET;
  bool bVar6;
  char c;
  stbi_uc local_29;
  
  psVar2 = s->img_buffer_original;
  psVar4 = s->img_buffer_original_end;
  s->img_buffer = psVar2;
  s->img_buffer_end = psVar4;
  if (psVar2 < psVar4) {
LAB_00164136:
    s->img_buffer = psVar2 + 1;
    bVar6 = *psVar2 != 'P';
    psVar2 = psVar2 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar2 = s->img_buffer;
      psVar4 = s->img_buffer_end;
      goto LAB_00164136;
    }
    bVar6 = true;
  }
  if (psVar4 <= psVar2) {
    if (s->read_from_callbacks == 0) goto LAB_00164183;
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  psVar4 = psVar2 + 1;
  s->img_buffer = psVar4;
  if (!(bool)(~bVar6 & 0xfd < (byte)(*psVar2 - 0x37))) {
LAB_00164183:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    return 0;
  }
  if (comp != (int *)0x0) {
    *comp = (uint)(*psVar2 == '6') * 2 + 1;
    psVar4 = s->img_buffer;
  }
  if (psVar4 < s->img_buffer_end) {
LAB_001641d6:
    s->img_buffer = psVar4 + 1;
    local_29 = *psVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar4 = s->img_buffer;
      goto LAB_001641d6;
    }
    local_29 = '\0';
  }
  stbi__pnm_skip_whitespace(s,(char *)&local_29);
  iVar1 = stbi__pnm_getinteger(s,(char *)&local_29);
  if (x != (int *)0x0) {
    *x = iVar1;
  }
  if (iVar1 != 0) {
    stbi__pnm_skip_whitespace(s,(char *)&local_29);
    iVar1 = stbi__pnm_getinteger(s,(char *)&local_29);
    if (y != (int *)0x0) {
      *y = iVar1;
    }
    if (iVar1 != 0) {
      stbi__pnm_skip_whitespace(s,(char *)&local_29);
      iVar1 = stbi__pnm_getinteger(s,(char *)&local_29);
      if (iVar1 < 0x10000) {
        return (uint)(0xff < iVar1) * 8 + 8;
      }
      lVar3 = *in_FS_OFFSET;
      pcVar5 = "max value > 65535";
      goto LAB_0016427f;
    }
  }
  lVar3 = *in_FS_OFFSET;
  pcVar5 = "invalid width";
LAB_0016427f:
  *(char **)(lVar3 + -0x20) = pcVar5;
  return 0;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   if(*x == 0)
       return stbi__err("invalid width", "PPM image header had zero or overflowing width");
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   if (*y == 0)
       return stbi__err("invalid width", "PPM image header had zero or overflowing width");
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value
   if (maxv > 65535)
      return stbi__err("max value > 65535", "PPM image supports only 8-bit and 16-bit images");
   else if (maxv > 255)
      return 16;
   else
      return 8;
}